

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int compression_end_lzma(archive *a,la_zstream_conflict *lastrm)

{
  void *__ptr;
  lzma_stream *strm;
  la_zstream_conflict *lastrm_local;
  archive *a_local;
  
  __ptr = lastrm->real_stream;
  lzma_end(__ptr);
  free(__ptr);
  lastrm->valid = 0;
  lastrm->real_stream = (void *)0x0;
  return 0;
}

Assistant:

static int
compression_end_lzma(struct archive *a, struct la_zstream *lastrm)
{
	lzma_stream *strm;

	(void)a; /* UNUSED */
	strm = (lzma_stream *)lastrm->real_stream;
	lzma_end(strm);
	free(strm);
	lastrm->valid = 0;
	lastrm->real_stream = NULL;
	return (ARCHIVE_OK);
}